

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

RecyclerWeakReference<Js::DynamicType> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
         *this,DynamicType *key,DynamicType *value,bool add,bool checkForExisting)

{
  DynamicType *ptr;
  int iVar1;
  int **ppiVar2;
  WeakRefDictionaryEntry<Js::DynamicType,_Memory::WriteBarrierPtr<Js::DynamicType>_> **ppWVar3;
  RecyclerWeakReference<Js::DynamicType> **ppRVar4;
  RecyclerWeakReference<Js::DynamicType> *pRVar5;
  RecyclerWeakReference<Js::DynamicType> *weakRef;
  int local_38;
  int i;
  int previous;
  uint bucket;
  hash_t hash;
  bool checkForExisting_local;
  bool add_local;
  DynamicType *value_local;
  DynamicType *key_local;
  WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
  *this_local;
  
  bucket._2_1_ = checkForExisting;
  bucket._3_1_ = add;
  _hash = value;
  value_local = key;
  key_local = (DynamicType *)this;
  ppiVar2 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  if (*ppiVar2 == (int *)0x0) {
    Initialize(this,0);
  }
  previous = GetHashCode<Js::DynamicType>(this,value_local);
  i = PrimePolicy::GetBucket(previous,this->size,this->modFunctionIndex);
  if ((bucket._2_1_ & 1) != 0) {
    local_38 = -1;
    iVar1 = FindEntry<Js::DynamicType>(this,value_local,previous,(uint *)&i,&local_38);
    ptr = _hash;
    if (iVar1 != -1) {
      if ((bucket._3_1_ & 1) == 0) {
        ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        Memory::WriteBarrierPtr<Js::DynamicType>::operator=(&(*ppWVar3)[iVar1].value,ptr);
        this->version = this->version + 1;
        ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                            ((WriteBarrierPtr *)&(*ppWVar3)[iVar1].key);
        return *ppRVar4;
      }
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  pRVar5 = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>(this->recycler,value_local);
  pRVar5 = Insert(this,pRVar5,_hash,previous,i);
  return pRVar5;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }